

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mv_generic.h
# Opt level: O2

void m2v_permute_rows(m2v *M,int *rowperm)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  m2v_base *pmVar4;
  ulong uVar5;
  long lVar6;
  int i;
  ulong uVar7;
  undefined8 uStack_60;
  m2v_base amStack_58 [2];
  undefined1 local_50 [8];
  m2v rowbuf_mat;
  
  uVar1 = M->n_row;
  uVar7 = (ulong)uVar1;
  lVar6 = -(uVar7 + 0xf & 0xfffffffffffffff0);
  pmVar4 = (m2v_base *)((long)amStack_58 + lVar6);
  rowbuf_mat.e = pmVar4;
  uVar3 = 0;
  uVar5 = 0;
  if (0 < (int)uVar1) {
    uVar5 = (ulong)uVar1;
  }
  for (; uVar5 != uVar3; uVar3 = uVar3 + 1) {
    *(undefined1 *)((long)pmVar4 + uVar3) = 0;
  }
  iVar2 = M->n_col;
  *(undefined8 *)((long)&uStack_60 + lVar6) = 0x20;
  uVar3 = (long)(iVar2 + 0x1f) / (long)(int)*(undefined8 *)((long)&uStack_60 + lVar6);
  lVar6 = (long)pmVar4 - ((uVar3 & 0xffffffff) * 4 + 0xf & 0xfffffffffffffff0);
  local_50._0_4_ = 1;
  rowbuf_mat.n_row = (int)uVar3;
  local_50._4_4_ = iVar2;
  rowbuf_mat._8_8_ = lVar6;
  for (uVar3 = 0; (long)uVar3 < (long)(int)uVar7; uVar3 = uVar3 + 1) {
    if (*(char *)((long)rowbuf_mat.e + uVar3) == '\0') {
      if (uVar3 == (uint)rowperm[uVar3]) {
        *(undefined1 *)((long)rowbuf_mat.e + uVar3) = 1;
      }
      else {
        *(undefined8 *)(lVar6 + -8) = 0x101985;
        m2v_copy_row(M,(int)uVar3,(m2v *)local_50,0);
        uVar5 = uVar3 & 0xffffffff;
        uVar7 = uVar3;
        while( true ) {
          uVar1 = rowperm[uVar7];
          if (uVar3 == uVar1) break;
          uVar7 = (ulong)(int)uVar1;
          *(undefined1 *)((long)rowbuf_mat.e + uVar7) = 1;
          *(undefined8 *)(lVar6 + -8) = 0x1019ab;
          m2v_copy_row(M,uVar1,M,(int)uVar5);
          uVar5 = (ulong)uVar1;
        }
        *(undefined1 *)((long)rowbuf_mat.e + uVar3) = 1;
        *(undefined8 *)(lVar6 + -8) = 0x1019cd;
        m2v_copy_row((m2v *)local_50,0,M,(int)uVar5);
        uVar7 = (ulong)(uint)M->n_row;
      }
    }
  }
  return;
}

Assistant:

void MV_GEN_N(_permute_rows)(MV_GEN_TYPE* M, const int* rowperm)
{
	char visited[M->n_row];
	for (int i = 0; i < M->n_row; ++i)
		visited[i] = 0;

	MV_GEN_N(_Def)(rowbuf_mat, rowbuf, 1, M->n_col)
	for (int i = 0; i < M->n_row; ++i) {
		if (visited[i])
			continue;
		if (rowperm[i] == i) {
			/* Simple case of a self-cycle; do nothing. */
			visited[i] = 1;
			continue;
		}

		/* Otherwise we need to shuffle things around. */
		MV_GEN_N(_copy_row)(M, i, &rowbuf_mat, 0);
		int e = i, e_next = rowperm[i];
		while (e_next != i) {
			assert(!visited[e_next]);
			visited[e_next] = 1;
			MV_GEN_N(_copy_row)(M, e_next, M, e);

			/* Advance in the cycle */
			e = e_next;
			e_next = rowperm[e_next];
		}
		visited[i] = 1;
		MV_GEN_N(_copy_row)(&rowbuf_mat, 0, M, e);
	}
}